

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O0

WJTL_STATUS TestNestedTooDeep(void)

{
  WJTL_STATUS WVar1;
  JL_STATUS JVar2;
  bool bVar3;
  _Bool _result_11;
  _Bool _result_10;
  _Bool _result_9;
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  _Bool _result;
  JlDataObject *objectTree;
  char *jsonText;
  WJTL_STATUS TestReturn;
  
  jsonText._4_4_ = WJTL_STATUS_SUCCESS;
  objectTree = (JlDataObject *)0x0;
  __result_7 = (JlDataObject *)0x0;
  WVar1 = GenerateNestedJsonList(0x40,(char **)&objectTree);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(GenerateNestedJsonList( 64, &jsonText ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4ba);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    jsonText._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar2 = JlParseJson((char *)objectTree,(JlDataObject **)&_result_7,(size_t *)0x0);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJson( jsonText, &objectTree, ((void*)0) ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4bb);
  if (JVar2 != JL_STATUS_SUCCESS) {
    jsonText._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar2 = JlFreeObjectTree((JlDataObject **)&_result_7);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &objectTree ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4bc);
  if (JVar2 != JL_STATUS_SUCCESS) {
    jsonText._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Free(objectTree);
  objectTree = (JlDataObject *)0x0;
  WVar1 = GenerateNestedJsonList(0x41,(char **)&objectTree);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(GenerateNestedJsonList( 64+1, &jsonText ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4c1);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    jsonText._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar2 = JlParseJson((char *)objectTree,(JlDataObject **)&_result_7,(size_t *)0x0);
  WjTestLib_Assert(JVar2 == JL_STATUS_JSON_NESTING_TOO_DEEP,
                   "(JlParseJson( jsonText, &objectTree, ((void*)0) )) == (JL_STATUS_JSON_NESTING_TOO_DEEP)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4c2);
  if (JVar2 != JL_STATUS_JSON_NESTING_TOO_DEEP) {
    jsonText._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = __result_7 == (JlDataObject *)0x0;
  WjTestLib_Assert(bVar3,"(objectTree) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4c3);
  if (!bVar3) {
    jsonText._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Free(objectTree);
  objectTree = (JlDataObject *)0x0;
  WVar1 = GenerateNestedJsonDictionary(0x40,(char **)&objectTree);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(GenerateNestedJsonDictionary( 64, &jsonText ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4ca);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    jsonText._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar2 = JlParseJson((char *)objectTree,(JlDataObject **)&_result_7,(size_t *)0x0);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJson( jsonText, &objectTree, ((void*)0) ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4cb);
  if (JVar2 != JL_STATUS_SUCCESS) {
    jsonText._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar2 = JlFreeObjectTree((JlDataObject **)&_result_7);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &objectTree ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4cc);
  if (JVar2 != JL_STATUS_SUCCESS) {
    jsonText._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Free(objectTree);
  objectTree = (JlDataObject *)0x0;
  WVar1 = GenerateNestedJsonDictionary(0x41,(char **)&objectTree);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(GenerateNestedJsonDictionary( 64+1, &jsonText ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4d1);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    jsonText._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar2 = JlParseJson((char *)objectTree,(JlDataObject **)&_result_7,(size_t *)0x0);
  WjTestLib_Assert(JVar2 == JL_STATUS_JSON_NESTING_TOO_DEEP,
                   "(JlParseJson( jsonText, &objectTree, ((void*)0) )) == (JL_STATUS_JSON_NESTING_TOO_DEEP)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4d2);
  if (JVar2 != JL_STATUS_JSON_NESTING_TOO_DEEP) {
    jsonText._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = __result_7 == (JlDataObject *)0x0;
  WjTestLib_Assert(bVar3,"(objectTree) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4d3);
  if (!bVar3) {
    jsonText._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Free(objectTree);
  return jsonText._4_4_;
}

Assistant:

static
WJTL_STATUS
    TestNestedTooDeep
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    char* jsonText = NULL;
    JlDataObject* objectTree = NULL;

    // Test deep lists

    // Check MAX_JSON_DEPTH levels - The max amount that will work
    JL_ASSERT_SUCCESS( GenerateNestedJsonList( MAX_JSON_DEPTH, &jsonText ) );
    JL_ASSERT_SUCCESS( JlParseJson( jsonText, &objectTree, NULL ) );
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &objectTree ) );
    JlFree( jsonText );
    jsonText = NULL;

    // Check one greater than MAX_JSON_DEPTH levels - This should fail. Make sure there is no memory leak
    JL_ASSERT_SUCCESS( GenerateNestedJsonList( MAX_JSON_DEPTH+1, &jsonText ) );
    JL_ASSERT_STATUS( JlParseJson( jsonText, &objectTree, NULL ), JL_STATUS_JSON_NESTING_TOO_DEEP );
    JL_ASSERT_NULL( objectTree );
    JlFree( jsonText );
    jsonText = NULL;

    // Now test dictionaries that are nested deeply

    // Check MAX_JSON_DEPTH level - the max amount that will work
    JL_ASSERT_SUCCESS( GenerateNestedJsonDictionary( MAX_JSON_DEPTH, &jsonText ) );
    JL_ASSERT_SUCCESS( JlParseJson( jsonText, &objectTree, NULL ) );
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &objectTree ) );
    JlFree( jsonText );
    jsonText = NULL;

    // Check one greater than MAX_JSON_DEPTH levels - This should fail. Make sure there is no memory leak
    JL_ASSERT_SUCCESS( GenerateNestedJsonDictionary( MAX_JSON_DEPTH+1, &jsonText ) );
    JL_ASSERT_STATUS( JlParseJson( jsonText, &objectTree, NULL ), JL_STATUS_JSON_NESTING_TOO_DEEP );
    JL_ASSERT_NULL( objectTree );
    JlFree( jsonText );
    jsonText = NULL;

    return TestReturn;
}